

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_assertion.hpp
# Opt level: O2

void __thiscall
iutest::AssertionHelper::OnFixed(AssertionHelper *this,Fixed *fixed,bool isException)

{
  code *pcVar1;
  bool bVar2;
  ScopedTrace *this_00;
  TestPartResultReporterInterface *pTVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string append_message;
  
  std::__cxx11::stringbuf::str();
  if (append_message._M_string_length != 0) {
    std::operator+(&bStack_58," ",&append_message);
    std::__cxx11::string::append((string *)this);
    std::__cxx11::string::~string((string *)&bStack_58);
  }
  this_00 = ScopedTrace::GetInstance();
  ScopedTrace::append_message(this_00,&this->m_part_result,isException);
  pTVar3 = TestEnv::GetGlobalTestPartResultReporter();
  if (pTVar3 == (TestPartResultReporterInterface *)0x0) {
    detail::DefaultGlobalTestPartResultReporter::DefaultReportTestPartResult(&this->m_part_result);
  }
  else {
    pTVar3 = TestEnv::GetGlobalTestPartResultReporter();
    (*pTVar3->_vptr_TestPartResultReporterInterface[2])(pTVar3,this);
  }
  bVar2 = TestPartResult::failed(&this->m_part_result);
  if (bVar2) {
    bVar2 = TestFlag::IsEnableFlag(0x10);
    if (bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  std::__cxx11::string::~string((string *)&append_message);
  return;
}

Assistant:

void OnFixed(const Fixed& fixed, bool isException = false)
    {
        // OnFixed で throw しないこと！テスト側の例外キャッチにかからなくなる
        const ::std::string append_message = fixed.GetString();
        if( !append_message.empty() )
        {
            m_part_result.add_message(" " + append_message);
        }
        ScopedTrace::GetInstance().append_message(m_part_result, isException);

        if( TestEnv::GetGlobalTestPartResultReporter() != IUTEST_NULLPTR )
        {
            TestEnv::GetGlobalTestPartResultReporter()->ReportTestPartResult(m_part_result);
        }
        else
        {
            detail::DefaultReportTestPartResult(m_part_result);
        }

        if IUTEST_COND_UNLIKELY(m_part_result.failed()
            && TestFlag::IsEnableFlag(iutest::TestFlag::BREAK_ON_FAILURE))
        {
            IUTEST_BREAK();
        }